

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O3

Emitter * __thiscall YAML::Emitter::Write(Emitter *this,_Null *param_1)

{
  uint uVar1;
  undefined *in_RCX;
  void *__buf;
  char *pcVar2;
  allocator local_31;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  if (((this->m_pState)._M_t.
       super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>._M_t.
       super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>.
       super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl)->m_isGood == true) {
    PrepareNode(this,Scalar);
    uVar1 = (((this->m_pState)._M_t.
              super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>.
              _M_t.
              super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
              .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl)->m_nullFmt).m_value
            - LowerNull;
    if (uVar1 < 3) {
      in_RCX = &DAT_008778d8;
      pcVar2 = *(char **)(&DAT_008778d8 + (ulong)uVar1 * 8);
    }
    else {
      pcVar2 = "~";
    }
    std::__cxx11::string::string((string *)local_30,pcVar2,&local_31);
    ostream_wrapper::write(&this->m_stream,(int)(string *)local_30,__buf,(size_t)in_RCX);
    if (local_30[0] != local_20) {
      operator_delete(local_30[0]);
    }
    EmitterState::StartedScalar
              ((this->m_pState)._M_t.
               super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>.
               _M_t.
               super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
               .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl);
  }
  return this;
}

Assistant:

Emitter& Emitter::Write(const _Null& /*null*/) {
  if (!good())
    return *this;

  PrepareNode(EmitterNodeType::Scalar);

  m_stream << ComputeNullName();

  StartedScalar();

  return *this;
}